

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool __thiscall
libcellml::Variable::VariableImpl::hasEquivalentVariable
          (VariableImpl *this,VariablePtr *equivalentVariable,bool considerIndirectEquivalences)

{
  bool bVar1;
  __weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<const_std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
  local_38;
  __normal_iterator<const_std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
  local_30;
  const_iterator it;
  bool equivalent;
  bool considerIndirectEquivalences_local;
  VariablePtr *equivalentVariable_local;
  VariableImpl *this_local;
  
  it._M_current._6_1_ = 0;
  it._M_current._7_1_ = considerIndirectEquivalences;
  if (considerIndirectEquivalences) {
    it._M_current._6_1_ = hasIndirectEquivalentVariable(this,equivalentVariable);
  }
  else {
    local_30._M_current =
         (weak_ptr<libcellml::Variable> *)findEquivalentVariable(this,equivalentVariable);
    local_38._M_current =
         (weak_ptr<libcellml::Variable> *)
         std::
         vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
         ::end(&this->mEquivalentVariables);
    bVar1 = __gnu_cxx::operator==(&local_30,&local_38);
    if (bVar1) {
      return false;
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
               ::operator->(&local_30)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
    bVar1 = std::__weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::expired(this_00);
    it._M_current._6_1_ = (bVar1 ^ 0xffU) & 1;
  }
  return (bool)it._M_current._6_1_;
}

Assistant:

bool Variable::VariableImpl::hasEquivalentVariable(const VariablePtr &equivalentVariable, bool considerIndirectEquivalences) const
{
    bool equivalent = false;
    if (considerIndirectEquivalences) {
        equivalent = hasIndirectEquivalentVariable(equivalentVariable);
    } else {
        auto it = findEquivalentVariable(equivalentVariable);
        if (it == mEquivalentVariables.end()) {
            return false;
        }
        equivalent = !it->expired();
    }

    return equivalent;
}